

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

shared_ptr<cxxopts::Value> cxxopts::value<char>(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cxxopts::Value> sVar1;
  undefined1 local_29;
  standard_value<char> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (standard_value<char> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cxxopts::values::standard_value<char>,std::allocator<cxxopts::values::standard_value<char>>>
            (&local_20,&local_28,(allocator<cxxopts::values::standard_value<char>_> *)&local_29);
  std::__shared_ptr<cxxopts::values::standard_value<char>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cxxopts::values::standard_value<char>,cxxopts::values::standard_value<char>>
            ((__shared_ptr<cxxopts::values::standard_value<char>,(__gnu_cxx::_Lock_policy)2> *)
             &local_28,local_28);
  in_RDI->_vptr_Value = (_func_int **)local_28;
  (in_RDI->super_enable_shared_from_this<cxxopts::Value>)._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (in_RDI->super_enable_shared_from_this<cxxopts::Value>)._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_20._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
  value()
  {
    return std::make_shared<values::standard_value<T>>();
  }